

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

float __thiscall dynet::Trainer::clip_gradients(Trainer *this)

{
  ostream *this_00;
  runtime_error *this_01;
  float fVar1;
  float fVar2;
  string local_1b0 [32];
  ostringstream oss;
  
  fVar2 = 1.0;
  if (this->clipping_enabled == true) {
    fVar1 = ParameterCollection::gradient_l2_norm(this->model);
    if (0x7f7fffff < (uint)ABS(fVar1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      this_00 = std::operator<<((ostream *)&oss,"Magnitude of gradient is bad: ");
      std::ostream::operator<<(this_00,fVar1);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,local_1b0);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar2 = 1.0;
    if (this->clip_threshold < fVar1) {
      this->clips = this->clips + 1.0;
      this->clips_since_status = this->clips_since_status + 1.0;
      fVar2 = this->clip_threshold / fVar1;
    }
  }
  return fVar2;
}

Assistant:

float Trainer::clip_gradients() {
  float gscale = 1;
  if (clipping_enabled) {
    float gg = model->gradient_l2_norm();
    if (isnan(gg) || isinf(gg)) {
      ostringstream oss; oss << "Magnitude of gradient is bad: " << gg;
      throw std::runtime_error(oss.str());
    }
    if (gg > clip_threshold) {
      ++clips;
      ++clips_since_status;
      gscale = clip_threshold / gg;
    }
  }
  return gscale;
}